

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyser.cpp
# Opt level: O3

void __thiscall Analyser::analyse_parameter_clause(Analyser *this)

{
  ulong uVar1;
  pointer pTVar2;
  _Storage *p_Var3;
  int iVar4;
  long *plVar5;
  string *psVar6;
  mapped_type *this_00;
  long *plVar7;
  bool bVar8;
  char type;
  optional<Token> next;
  vector<char,_std::allocator<char>_> paramTypes;
  char local_151;
  _func_void__Op_any_ptr__Arg_ptr *local_150;
  _Storage local_148;
  undefined1 local_140 [32];
  char local_120;
  _Arg local_118;
  undefined1 local_110 [32];
  bool local_f0;
  vector<char,_std::allocator<char>_> local_e8;
  undefined1 *local_d0;
  long local_c8;
  undefined1 local_c0 [16];
  undefined1 *local_b0;
  long local_a8;
  undefined1 local_a0 [16];
  undefined1 *local_90;
  long local_88;
  undefined1 local_80 [16];
  undefined1 *local_70;
  long local_68;
  undefined1 local_60 [16];
  undefined1 *local_50;
  long local_48;
  undefined1 local_40 [16];
  
  nextToken((optional<Token> *)local_110,this);
  if ((local_f0 != true) || (local_110._0_4_ != LEFT_BRACKET)) {
    psVar6 = (string *)__cxa_allocate_exception(0x28);
    local_50 = local_40;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"Missing \'(\'","");
    iVar4 = this->_currentLine;
    *(string **)psVar6 = psVar6 + 0x10;
    std::__cxx11::string::_M_construct<char*>(psVar6,local_50,local_50 + local_48);
    *(long *)(psVar6 + 0x20) = (long)iVar4;
    __cxa_throw(psVar6,&Error::typeinfo,Error::~Error);
  }
  nextToken((optional<Token> *)&((_Storage<Token,_false> *)local_140)->_M_value,this);
  std::_Optional_payload_base<Token>::_M_move_assign
            ((_Optional_payload_base<Token> *)local_110,
             (_Optional_payload_base<Token> *)&((_Storage<Token,_false> *)local_140)->_M_value);
  if (local_120 == '\x01') {
    std::_Optional_payload_base<Token>::_M_destroy
              ((_Optional_payload_base<Token> *)&((_Storage<Token,_false> *)local_140)->_M_value);
  }
  local_e8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  local_e8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  local_e8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  p_Var3 = (_Storage *)((long)&(((_Storage<Token,_false> *)local_140)->_M_value)._value + 8);
  bVar8 = local_110._0_4_ == RESERVED_WORD;
  while (((local_f0 & 1U) != 0 && (bVar8))) {
    local_148._M_ptr = (void *)0x0;
    if ((_func_void__Op_any_ptr__Arg_ptr *)local_110._8_8_ == (_func_void__Op_any_ptr__Arg_ptr *)0x0
       ) {
      local_150 = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
    }
    else {
      local_118._M_obj = &local_150;
      (*(code *)local_110._8_8_)(_Op_clone,(any *)(local_110 + 8),&local_118);
    }
    plVar5 = (long *)std::__any_caster<std::__cxx11::string>((any *)&local_150);
    if (plVar5 == (long *)0x0) {
      std::__throw_bad_any_cast();
    }
    plVar7 = plVar5 + 2;
    if ((_Storage *)*plVar5 == (_Storage *)plVar7) {
      local_140._16_8_ = *plVar7;
      local_140._24_8_ = plVar5[3];
      local_140._0_8_ = p_Var3;
    }
    else {
      local_140._16_8_ = *plVar7;
      local_140._0_8_ = (_Storage *)*plVar5;
    }
    local_140._8_8_ = plVar5[1];
    *plVar5 = (long)plVar7;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    iVar4 = std::__cxx11::string::compare((char *)local_140);
    if ((_Storage *)local_140._0_8_ != p_Var3) {
      operator_delete((void *)local_140._0_8_,local_140._16_8_ + 1);
    }
    if (local_150 != (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
      (*local_150)(_Op_destroy,(any *)&local_150,(_Arg *)0x0);
    }
    if (iVar4 == 0) {
      local_151 = analyse_type_specifier(this);
      std::vector<char,std::allocator<char>>::emplace_back<char&>
                ((vector<char,std::allocator<char>> *)&local_e8,&local_151);
      nextToken((optional<Token> *)&((_Storage<Token,_false> *)local_140)->_M_value,this);
      std::_Optional_payload_base<Token>::_M_move_assign
                ((_Optional_payload_base<Token> *)local_110,
                 (_Optional_payload_base<Token> *)&((_Storage<Token,_false> *)local_140)->_M_value);
      if (local_120 == '\x01') {
        std::_Optional_payload_base<Token>::_M_destroy
                  ((_Optional_payload_base<Token> *)&((_Storage<Token,_false> *)local_140)->_M_value
                  );
      }
      if ((local_f0 != true) || (local_110._0_4_ != IDENTIFIER)) {
        psVar6 = (string *)__cxa_allocate_exception(0x28);
        local_70 = local_60;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_70,"Missing <identifier>","");
        iVar4 = this->_currentLine;
        *(string **)psVar6 = psVar6 + 0x10;
        std::__cxx11::string::_M_construct<char*>(psVar6,local_70,local_70 + local_68);
        *(long *)(psVar6 + 0x20) = (long)iVar4;
        __cxa_throw(psVar6,&Error::typeinfo,Error::~Error);
      }
      local_148._M_ptr = (void *)0x0;
      if ((_func_void__Op_any_ptr__Arg_ptr *)local_110._8_8_ ==
          (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
        local_150 = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
      }
      else {
        local_118._M_obj = &local_150;
        (*(code *)local_110._8_8_)(_Op_clone,(any *)(local_110 + 8),&local_118);
      }
      plVar5 = (long *)std::__any_caster<std::__cxx11::string>((any *)&local_150);
      if (plVar5 == (long *)0x0) {
        std::__throw_bad_any_cast();
      }
      plVar7 = plVar5 + 2;
      if ((_Storage *)*plVar5 == (_Storage *)plVar7) {
        local_140._16_8_ = *plVar7;
        local_140._24_8_ = plVar5[3];
        local_140._0_8_ = p_Var3;
      }
      else {
        local_140._16_8_ = *plVar7;
        local_140._0_8_ = (_Storage *)*plVar5;
      }
      local_140._8_8_ = plVar5[1];
      *plVar5 = (long)plVar7;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      addVariable(this,(string *)&((_Storage<Token,_false> *)local_140)->_M_value,true);
      if ((_Storage *)local_140._0_8_ != p_Var3) {
        operator_delete((void *)local_140._0_8_,local_140._16_8_ + 1);
      }
      if (local_150 != (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
        (*local_150)(_Op_destroy,(any *)&local_150,(_Arg *)0x0);
      }
    }
    else {
      uVar1 = this->_offset;
      if (uVar1 != 0) {
        pTVar2 = (this->_tokens).super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if (uVar1 < (ulong)((long)(this->_tokens).super__Vector_base<Token,_std::allocator<Token>_>.
                                  _M_impl.super__Vector_impl_data._M_finish - (long)pTVar2 >> 5)) {
          this->_currentLine = (int32_t)pTVar2[uVar1 - 1]._lineNumber;
        }
        this->_offset = uVar1 - 1;
      }
      local_151 = analyse_type_specifier(this);
      std::vector<char,std::allocator<char>>::emplace_back<char&>
                ((vector<char,std::allocator<char>> *)&local_e8,&local_151);
      nextToken((optional<Token> *)&((_Storage<Token,_false> *)local_140)->_M_value,this);
      std::_Optional_payload_base<Token>::_M_move_assign
                ((_Optional_payload_base<Token> *)local_110,
                 (_Optional_payload_base<Token> *)&((_Storage<Token,_false> *)local_140)->_M_value);
      if (local_120 == '\x01') {
        std::_Optional_payload_base<Token>::_M_destroy
                  ((_Optional_payload_base<Token> *)&((_Storage<Token,_false> *)local_140)->_M_value
                  );
      }
      if ((local_f0 != true) || (local_110._0_4_ != IDENTIFIER)) {
        psVar6 = (string *)__cxa_allocate_exception(0x28);
        local_90 = local_80;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_90,"Missing <identifier>","");
        iVar4 = this->_currentLine;
        *(string **)psVar6 = psVar6 + 0x10;
        std::__cxx11::string::_M_construct<char*>(psVar6,local_90,local_90 + local_88);
        *(long *)(psVar6 + 0x20) = (long)iVar4;
        __cxa_throw(psVar6,&Error::typeinfo,Error::~Error);
      }
      local_148._M_ptr = (void *)0x0;
      if ((_func_void__Op_any_ptr__Arg_ptr *)local_110._8_8_ ==
          (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
        local_150 = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
      }
      else {
        local_118._M_obj = &local_150;
        (*(code *)local_110._8_8_)(_Op_clone,(any *)(local_110 + 8),&local_118);
      }
      plVar5 = (long *)std::__any_caster<std::__cxx11::string>((any *)&local_150);
      if (plVar5 == (long *)0x0) {
        std::__throw_bad_any_cast();
      }
      plVar7 = plVar5 + 2;
      if ((_Storage *)*plVar5 == (_Storage *)plVar7) {
        local_140._16_8_ = *plVar7;
        local_140._24_8_ = plVar5[3];
        local_140._0_8_ = p_Var3;
      }
      else {
        local_140._16_8_ = *plVar7;
        local_140._0_8_ = (_Storage *)*plVar5;
      }
      local_140._8_8_ = plVar5[1];
      *plVar5 = (long)plVar7;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      addVariable(this,(string *)&((_Storage<Token,_false> *)local_140)->_M_value,false);
      if ((_Storage *)local_140._0_8_ != p_Var3) {
        operator_delete((void *)local_140._0_8_,local_140._16_8_ + 1);
      }
      if (local_150 != (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
        (*local_150)(_Op_destroy,(any *)&local_150,(_Arg *)0x0);
      }
    }
    nextToken((optional<Token> *)&((_Storage<Token,_false> *)local_140)->_M_value,this);
    std::_Optional_payload_base<Token>::_M_move_assign
              ((_Optional_payload_base<Token> *)local_110,
               (_Optional_payload_base<Token> *)&((_Storage<Token,_false> *)local_140)->_M_value);
    if (local_120 == '\x01') {
      std::_Optional_payload_base<Token>::_M_destroy
                ((_Optional_payload_base<Token> *)&((_Storage<Token,_false> *)local_140)->_M_value);
    }
    if ((local_f0 != true) || (local_110._0_4_ != COMMA_SIGH)) break;
    nextToken((optional<Token> *)&((_Storage<Token,_false> *)local_140)->_M_value,this);
    std::_Optional_payload_base<Token>::_M_move_assign
              ((_Optional_payload_base<Token> *)local_110,
               (_Optional_payload_base<Token> *)&((_Storage<Token,_false> *)local_140)->_M_value);
    if (local_120 == '\x01') {
      std::_Optional_payload_base<Token>::_M_destroy
                ((_Optional_payload_base<Token> *)&((_Storage<Token,_false> *)local_140)->_M_value);
    }
    if ((local_f0 != true) || (bVar8 = true, local_110._0_4_ != RESERVED_WORD)) {
      psVar6 = (string *)__cxa_allocate_exception(0x28);
      local_b0 = local_a0;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"Missing <identifier>","")
      ;
      iVar4 = this->_currentLine;
      *(string **)psVar6 = psVar6 + 0x10;
      std::__cxx11::string::_M_construct<char*>(psVar6,local_b0,local_b0 + local_a8);
      *(long *)(psVar6 + 0x20) = (long)iVar4;
      __cxa_throw(psVar6,&Error::typeinfo,Error::~Error);
    }
  }
  this_00 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>_>_>_>
            ::operator[](&this->_functionParameter,&this->_currentFunctionName);
  std::vector<char,_std::allocator<char>_>::operator=(this_00,&local_e8);
  if ((local_f0 == true) && (local_110._0_4_ == RIGHT_BRACKET)) {
    if (local_e8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_e8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_e8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_e8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if ((local_f0 & 1U) != 0) {
      std::_Optional_payload_base<Token>::_M_destroy((_Optional_payload_base<Token> *)local_110);
    }
    return;
  }
  psVar6 = (string *)__cxa_allocate_exception(0x28);
  local_d0 = local_c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"Missing \')\'","");
  iVar4 = this->_currentLine;
  *(string **)psVar6 = psVar6 + 0x10;
  std::__cxx11::string::_M_construct<char*>(psVar6,local_d0,local_d0 + local_c8);
  *(long *)(psVar6 + 0x20) = (long)iVar4;
  __cxa_throw(psVar6,&Error::typeinfo,Error::~Error);
}

Assistant:

void Analyser::analyse_parameter_clause() {
	auto next = nextToken();
	if (!next.has_value() || next.value().GetType() != TokenType::LEFT_BRACKET) {
		throw Error("Missing '('", _currentLine);
	}
	//<parameter-declaration>
	next = nextToken();
	std::vector<char> paramTypes;
	while (true) {
		if (!next.has_value() || next.value().GetType() != TokenType::RESERVED_WORD) {
			break;
		}
		//const
		if (std::any_cast<std::string>(next.value().GetValue()) == "const") {
			char type = analyse_type_specifier();
			paramTypes.emplace_back(type);
			//<identifier>
			next = nextToken();
			if (!next.has_value() || (next.value().GetType() != TokenType::IDENTIFIER)) {
				throw Error("Missing <identifier>", _currentLine);
			}
			addVariable(std::any_cast<std::string>(next.value().GetValue()), true);
		}
		//non-const
		else {
			unreadToken();
			char type = analyse_type_specifier();
			paramTypes.emplace_back(type);
			next = nextToken();
			if (!next.has_value() || (next.value().GetType() != TokenType::IDENTIFIER)) {
				throw Error("Missing <identifier>", _currentLine);
			}
			addVariable(std::any_cast<std::string>(next.value().GetValue()), false);
		}
		//','
		next = nextToken();
		if (!next.has_value() || next.value().GetType() != TokenType::COMMA_SIGH) {
			break;
		}
		//Ԥ���ж��Ƿ�Ϊfunc(int a ,)���ִ�������
		next = nextToken();
		if (!next.has_value() || next.value().GetType() != TokenType::RESERVED_WORD) {
			throw Error("Missing <identifier>", _currentLine);
		}
	}
	addFunctionParameter(paramTypes);
	if (!next.has_value() || next.value().GetType() != TokenType::RIGHT_BRACKET) {
		throw Error("Missing ')'", _currentLine);
	}
}